

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O2

bool __thiscall
double_conversion::DoubleToStringConverter::ToExponential
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long in_FS_OFFSET;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [122];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    if (requested_digits - 0x79U < 0xffffff86) {
      bVar3 = false;
    }
    else {
      decimal_point = -0x55555556;
      sign = true;
      decimal_rep[0x70] = -0x56;
      decimal_rep[0x71] = -0x56;
      decimal_rep._114_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep[0x68] = -0x56;
      decimal_rep[0x69] = -0x56;
      decimal_rep[0x6a] = -0x56;
      decimal_rep[0x6b] = -0x56;
      decimal_rep[0x6c] = -0x56;
      decimal_rep[0x6d] = -0x56;
      decimal_rep[0x6e] = -0x56;
      decimal_rep[0x6f] = -0x56;
      decimal_rep._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      decimal_rep_length = -0x55555556;
      if (requested_digits == -1) {
        DoubleToAscii(value,SHORTEST,0,decimal_rep,0x7a,&sign,&decimal_rep_length,&decimal_point);
      }
      else {
        DoubleToAscii(value,PRECISION,requested_digits + 1,decimal_rep,0x7a,&sign,
                      &decimal_rep_length,&decimal_point);
        for (lVar4 = (long)decimal_rep_length; decimal_rep_length = requested_digits + 1,
            lVar4 <= (long)(ulong)(uint)requested_digits; lVar4 = lVar4 + 1) {
          decimal_rep[lVar4] = '0';
        }
      }
      if ((sign == true) && (value != 0.0 || (this->flags_ & 8U) == 0)) {
        iVar1 = *(int *)(result_builder + 0x10);
        *(int *)(result_builder + 0x10) = iVar1 + 1;
        *(undefined1 *)(*(long *)result_builder + (long)iVar1) = 0x2d;
      }
      CreateExponentialRepresentation
                (this,decimal_rep,decimal_rep_length,decimal_point + -1,result_builder);
      bVar3 = true;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return bVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    bVar3 = HandleSpecialValues(this,value,result_builder);
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToExponential(
    double value,
    int requested_digits,
    StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits < -1) return false;
  if (requested_digits > kMaxExponentialDigits) return false;

  int decimal_point;
  bool sign;
  // Add space for digit before the decimal point and the '\0' character.
  const int kDecimalRepCapacity = kMaxExponentialDigits + 2;
  DOUBLE_CONVERSION_ASSERT(kDecimalRepCapacity > kBase10MaximalLength);
  char decimal_rep[kDecimalRepCapacity];
#ifndef NDEBUG
  // Problem: there is an assert in StringBuilder::AddSubstring() that
  // will pass this buffer to strlen(), and this buffer is not generally
  // null-terminated.
  memset(decimal_rep, 0, sizeof(decimal_rep));
#endif
  int decimal_rep_length;

  if (requested_digits == -1) {
    DoubleToAscii(value, SHORTEST, 0,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
  } else {
    DoubleToAscii(value, PRECISION, requested_digits + 1,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
    DOUBLE_CONVERSION_ASSERT(decimal_rep_length <= requested_digits + 1);

    for (int i = decimal_rep_length; i < requested_digits + 1; ++i) {
      decimal_rep[i] = '0';
    }
    decimal_rep_length = requested_digits + 1;
  }

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  int exponent = decimal_point - 1;
  CreateExponentialRepresentation(decimal_rep,
                                  decimal_rep_length,
                                  exponent,
                                  result_builder);
  return true;
}